

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Instructions.cc
# Opt level: O2

void __thiscall flow::RetInstr::RetInstr(RetInstr *this,Value *result)

{
  initializer_list<flow::Value_*> __l;
  allocator_type local_31;
  Value *local_30;
  _Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_> local_28;
  
  __l._M_len = 1;
  __l._M_array = &local_30;
  local_30 = result;
  std::vector<flow::Value_*,_std::allocator<flow::Value_*>_>::vector
            ((vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_28,__l,&local_31);
  TerminateInstr::TerminateInstr
            (&this->super_TerminateInstr,
             (vector<flow::Value_*,_std::allocator<flow::Value_*>_> *)&local_28);
  std::_Vector_base<flow::Value_*,_std::allocator<flow::Value_*>_>::~_Vector_base(&local_28);
  (this->super_TerminateInstr).super_Instr.super_Value._vptr_Value =
       (_func_int **)&PTR__Instr_001b0370;
  return;
}

Assistant:

RetInstr::RetInstr(Value* result) : TerminateInstr({result}) {}